

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab_r::tab_r(tab_r *this,brdf *fr,int resolution)

{
  impl local_28;
  int local_1c;
  brdf *pbStack_18;
  int resolution_local;
  brdf *fr_local;
  tab_r *this_local;
  
  local_28._vptr_impl = (_func_int **)0x0;
  local_1c = resolution;
  pbStack_18 = fr;
  fr_local = (brdf *)this;
  fresnel::ideal<1>::ideal((ideal<1> *)&local_28);
  radial::radial(&this->super_radial,&local_28);
  fresnel::ideal<1>::~ideal((ideal<1> *)&local_28);
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00265cf0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_ndf);
  std::vector<djb::vec2,_std::allocator<djb::vec2>_>::vector(&this->m_cdf);
  std::vector<float,_std::allocator<float>_>::reserve(&this->m_ndf,(long)local_1c);
  extract_ndf(this,pbStack_18,local_1c);
  configure(this);
  return;
}

Assistant:

tab_r::tab_r(const brdf &fr, int resolution):
	radial(fresnel::ideal<1>())
{
	m_ndf.reserve(resolution);
	extract_ndf(fr, resolution);
	configure();
}